

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[3],kj::StringPtr&>
          (String *__return_storage_ptr__,kj *this,uint *params,char (*params_1) [2],uint *params_2,
          char (*params_3) [3],StringPtr *params_4)

{
  uint *puVar1;
  char (*value) [2];
  char (*value_00) [3];
  StringPtr *value_01;
  String *params_4_00;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  CappedArray<char,_14UL> local_78;
  ArrayPtr<const_char> local_60;
  CappedArray<char,_14UL> local_50;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char (*params_local_3) [3];
  uint *params_local_2;
  char (*params_local_1) [2];
  uint *params_local;
  
  params_4_00 = __return_storage_ptr__;
  local_38 = (StringPtr *)params_3;
  params_local_4 = (StringPtr *)params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [2])this;
  params_local = (uint *)__return_storage_ptr__;
  puVar1 = fwd<unsigned_int>((NoInfer<unsigned_int> *)this);
  toCharSequence<unsigned_int>(&local_50,puVar1);
  value = ::const((char (*) [2])params_local_2);
  local_60 = toCharSequence<char_const(&)[2]>(value);
  puVar1 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_3);
  toCharSequence<unsigned_int>(&local_78,puVar1);
  value_00 = ::const((char (*) [3])params_local_4);
  local_88 = toCharSequence<char_const(&)[3]>(value_00);
  value_01 = fwd<kj::StringPtr&>(local_38);
  local_98 = toCharSequence<kj::StringPtr&>(value_01);
  _::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_50,(CappedArray<char,_14UL> *)&local_60,
             (ArrayPtr<const_char> *)&local_78,(CappedArray<char,_14UL> *)&local_88,&local_98,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}